

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O2

void __thiscall
lscpp::stdio_transporter::write_message(stdio_transporter *this,string *str,bool newline)

{
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_00;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((int)CONCAT71(in_register_00000011,newline) == 0) {
    str_00 = &local_50;
    std::__cxx11::string::string((string *)str_00,(string *)str);
    write_message_impl(this,str_00,true);
  }
  else {
    str_00 = &local_30;
    std::operator+(str_00,str,"\r\n");
    write_message_impl(this,str_00,false);
  }
  std::__cxx11::string::~string((string *)str_00);
  return;
}

Assistant:

void stdio_transporter::write_message(std::string const &str, bool newline) {
  if (newline) {
#ifdef _WIN32
    write_message_impl(str + "\n");
#else
    write_message_impl(str + "\r\n");
#endif
  } else
    write_message_impl(str, true);
}